

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
::fulfill(AdapterPromiseNode<capnp::AnyPointer::Pipeline,_kj::_::PromiseAndFulfillerAdapter<capnp::AnyPointer::Pipeline>_>
          *this,Pipeline *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ExceptionOrValue local_1d0;
  Maybe<capnp::AnyPointer::Pipeline> local_38;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1d0.exception.ptr.isSet = false;
    local_38.ptr.isSet = true;
    local_38.ptr.field_1.value.hook.disposer = (value->hook).disposer;
    local_38.ptr.field_1.value.hook.ptr = (value->hook).ptr;
    (value->hook).ptr = (PipelineHook *)0x0;
    local_38.ptr.field_1.value.ops.ptr = (value->ops).ptr;
    local_38.ptr.field_1.value.ops.size_ = (value->ops).size_;
    local_38.ptr.field_1.value.ops.disposer = (value->ops).disposer;
    (value->ops).ptr = (PipelineOp *)0x0;
    (value->ops).size_ = 0;
    ExceptionOrValue::operator=(&(this->result).super_ExceptionOrValue,&local_1d0);
    Maybe<capnp::AnyPointer::Pipeline>::operator=(&(this->result).value,&local_38);
    uVar2 = local_38.ptr.field_1.value.ops.size_;
    uVar1 = local_38.ptr.field_1.value.ops.ptr;
    if (local_38.ptr.isSet == true) {
      if (local_38.ptr.field_1.value.ops.ptr != (PipelineOp *)0x0) {
        local_38.ptr.field_1.value.ops.ptr = (PipelineOp *)0x0;
        local_38.ptr.field_1.value.ops.size_ = 0;
        (**(local_38.ptr.field_1.value.ops.disposer)->_vptr_ArrayDisposer)
                  (local_38.ptr.field_1.value.ops.disposer,uVar1,8,uVar2,uVar2,0);
      }
      uVar1 = local_38.ptr.field_1.value.hook.ptr;
      if (local_38.ptr.field_1.value.hook.ptr != (PipelineHook *)0x0) {
        local_38.ptr.field_1.value.hook.ptr = (PipelineHook *)0x0;
        (**(local_38.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
                  (local_38.ptr.field_1.value.hook.disposer,
                   ((PipelineHook *)uVar1)->_vptr_PipelineHook[-2] +
                   (long)&((PipelineHook *)uVar1)->_vptr_PipelineHook);
      }
    }
    if (local_1d0.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1d0.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }